

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

void cf_hmac(uint8_t *key,size_t nkey,uint8_t *msg,size_t nmsg,uint8_t *out,cf_chash *hash)

{
  undefined1 local_310 [8];
  cf_hmac_ctx ctx;
  cf_chash *hash_local;
  uint8_t *out_local;
  size_t nmsg_local;
  uint8_t *msg_local;
  size_t nkey_local;
  uint8_t *key_local;
  
  ctx.outer._352_8_ = hash;
  if (out == (uint8_t *)0x0) {
    abort();
  }
  if (hash == (cf_chash *)0x0) {
    abort();
  }
  cf_hmac_init((cf_hmac_ctx *)local_310,hash,key,nkey);
  cf_hmac_update((cf_hmac_ctx *)local_310,msg,nmsg);
  cf_hmac_finish((cf_hmac_ctx *)local_310,out);
  return;
}

Assistant:

void cf_hmac(const uint8_t *key, size_t nkey,
             const uint8_t *msg, size_t nmsg,
             uint8_t *out,
             const cf_chash *hash)
{
  cf_hmac_ctx ctx;
  
  assert(out);
  assert(hash);

  cf_hmac_init(&ctx, hash, key, nkey);
  cf_hmac_update(&ctx, msg, nmsg);
  cf_hmac_finish(&ctx, out);
}